

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

void prepare_features_after_part_ab
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int part_ctx,int64_t best_rd,
               int64_t (*rect_part_rd) [2],int64_t *split_rd,uint pb_source_variance,int mi_row,
               int mi_col,aom_partition_features_t *features)

{
  int iVar1;
  uint uVar2;
  int in_ECX;
  buf_2d *in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000018;
  undefined4 in_stack_00000020;
  float var_ratio_1;
  int i_6;
  float var_ratio;
  int i_5;
  float high_b;
  float low_b;
  float denom;
  int i_4;
  buf_2d vert_4_src;
  buf_2d horz_4_src;
  MACROBLOCKD *xd;
  uint8_t *src;
  int src_stride;
  BLOCK_SIZE vert_4_bs;
  BLOCK_SIZE horz_4_bs;
  uint vert_4_source_var [4];
  uint horz_4_source_var [4];
  float rd_ratio;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int rd_index;
  int sub_block_rdcost [8];
  int rdcost;
  int feature_index;
  int64_t *vert_rd;
  int64_t *horz_rd;
  int in_stack_fffffffffffffeb8;
  BLOCK_SIZE in_stack_fffffffffffffebf;
  undefined2 uVar3;
  undefined8 in_stack_fffffffffffffec0;
  MACROBLOCKD *xd_00;
  int local_128;
  float local_120;
  int local_11c;
  float local_118;
  int local_114;
  undefined4 in_stack_fffffffffffffef0;
  BLOCK_SIZE bsize_00;
  int in_stack_fffffffffffffef4;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffffff00;
  MACROBLOCK *in_stack_ffffffffffffff08;
  uint local_a8 [4];
  uint local_98 [6];
  float local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68 [10];
  int local_40;
  int local_3c;
  long local_38;
  long local_30;
  long local_20;
  buf_2d *local_10;
  long local_8;
  
  bsize_00 = (BLOCK_SIZE)((uint)in_stack_fffffffffffffef0 >> 0x18);
  uVar3 = (undefined2)((ulong)in_stack_fffffffffffffec0 >> 0x28);
  local_38 = in_R9 + 0x10;
  local_3c = 1;
  *(float *)(_var_ratio_1 + 500) = (float)in_ECX;
  local_30 = in_R9;
  local_20 = in_R8;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar1 = get_unsigned_bits(0);
  *(float *)(_var_ratio_1 + 500 + (long)local_3c * 4) = (float)iVar1;
  if (local_20 < 0x80000000) {
    local_128 = (int)local_20;
  }
  else {
    local_128 = 0x7fffffff;
  }
  local_40 = local_128;
  local_3c = local_3c + 1;
  memset(local_68,0,0x20);
  local_6c = 0;
  for (local_70 = 0; local_70 < 2; local_70 = local_70 + 1) {
    if ((0 < *(long *)(local_30 + (long)local_70 * 8)) &&
       (*(long *)(local_30 + (long)local_70 * 8) < 1000000000)) {
      local_68[local_6c] = (int)*(undefined8 *)(local_30 + (long)local_70 * 8);
    }
    local_6c = local_6c + 1;
  }
  for (local_74 = 0; local_74 < 2; local_74 = local_74 + 1) {
    if ((0 < *(long *)(local_38 + (long)local_74 * 8)) &&
       (*(long *)(local_38 + (long)local_74 * 8) < 1000000000)) {
      local_68[local_6c] = (int)*(undefined8 *)(local_38 + (long)local_74 * 8);
    }
    local_6c = local_6c + 1;
  }
  for (local_78 = 0; local_78 < 4; local_78 = local_78 + 1) {
    if ((0 < *(long *)(in_stack_00000008 + (long)local_78 * 8)) &&
       (*(long *)(in_stack_00000008 + (long)local_78 * 8) < 1000000000)) {
      local_68[local_6c] = (int)*(undefined8 *)(in_stack_00000008 + (long)local_78 * 8);
    }
    local_6c = local_6c + 1;
  }
  for (local_7c = 0; iVar1 = local_3c, local_7c < 8; local_7c = local_7c + 1) {
    local_80 = 1.0;
    if ((0 < local_68[local_7c]) && (local_68[local_7c] < local_40)) {
      local_80 = (float)local_68[local_7c] / (float)local_40;
    }
    local_3c = local_3c + 1;
    *(float *)(_var_ratio_1 + 500 + (long)iVar1 * 4) = local_80;
  }
  memset(local_98,0,0x10);
  memset(local_a8,0,0x10);
  get_partition_subsize((BLOCK_SIZE)((ushort)uVar3 >> 8),(PARTITION_TYPE)uVar3);
  get_partition_subsize((BLOCK_SIZE)((ushort)uVar3 >> 8),(PARTITION_TYPE)uVar3);
  xd_00 = *(MACROBLOCKD **)(local_8 + 0x427a8);
  av1_num_planes((AV1_COMMON *)(local_8 + 0x3bf80));
  av1_setup_src_planes
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
             in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,bsize_00);
  for (iVar1 = 0; iVar1 < 4; iVar1 = iVar1 + 1) {
    uVar2 = av1_get_perpixel_variance_facade
                      ((AV1_COMP *)CONCAT44(in_stack_00000020,in_stack_00000018),xd_00,local_10,
                       in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8);
    local_98[iVar1] = uVar2;
    uVar2 = av1_get_perpixel_variance_facade
                      ((AV1_COMP *)CONCAT44(in_stack_00000020,in_stack_00000018),xd_00,local_10,
                       in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8);
    local_a8[iVar1] = uVar2;
  }
  for (local_114 = 0; iVar1 = local_3c, local_114 < 4; local_114 = local_114 + 1) {
    local_118 = (float)(local_98[local_114] + 1) / (float)(in_stack_00000010 + 1);
    if (local_118 < 0.1) {
      local_118 = 0.1;
    }
    if (10.0 < local_118) {
      local_118 = 10.0;
    }
    local_3c = local_3c + 1;
    *(float *)(_var_ratio_1 + 500 + (long)iVar1 * 4) = local_118;
  }
  for (local_11c = 0; iVar1 = local_3c, local_11c < 4; local_11c = local_11c + 1) {
    local_120 = (float)(local_a8[local_11c] + 1) / (float)(in_stack_00000010 + 1);
    if (local_120 < 0.1) {
      local_120 = 0.1;
    }
    if (10.0 < local_120) {
      local_120 = 10.0;
    }
    local_3c = local_3c + 1;
    *(float *)(_var_ratio_1 + 500 + (long)iVar1 * 4) = local_120;
  }
  return;
}

Assistant:

static void prepare_features_after_part_ab(
    const AV1_COMP *const cpi, MACROBLOCK *const x, BLOCK_SIZE bsize,
    int part_ctx, int64_t best_rd,
    int64_t rect_part_rd[NUM_RECT_PARTS][SUB_PARTITIONS_RECT],
    int64_t split_rd[SUB_PARTITIONS_SPLIT], unsigned int pb_source_variance,
    int mi_row, int mi_col, aom_partition_features_t *const features) {
  int64_t *horz_rd = rect_part_rd[HORZ];
  int64_t *vert_rd = rect_part_rd[VERT];

  // Generate features.
  int feature_index = 0;
  features->after_part_ab.f[feature_index++] = (float)part_ctx;
  features->after_part_ab.f[feature_index++] =
      (float)get_unsigned_bits(pb_source_variance);

  const int rdcost = (int)AOMMIN(INT_MAX, best_rd);
  int sub_block_rdcost[8] = { 0 };
  int rd_index = 0;
  for (int i = 0; i < SUB_PARTITIONS_RECT; ++i) {
    if (horz_rd[i] > 0 && horz_rd[i] < 1000000000)
      sub_block_rdcost[rd_index] = (int)horz_rd[i];
    ++rd_index;
  }
  for (int i = 0; i < SUB_PARTITIONS_RECT; ++i) {
    if (vert_rd[i] > 0 && vert_rd[i] < 1000000000)
      sub_block_rdcost[rd_index] = (int)vert_rd[i];
    ++rd_index;
  }
  for (int i = 0; i < SUB_PARTITIONS_SPLIT; ++i) {
    if (split_rd[i] > 0 && split_rd[i] < 1000000000)
      sub_block_rdcost[rd_index] = (int)split_rd[i];
    ++rd_index;
  }
  for (int i = 0; i < 8; ++i) {
    // Ratio between the sub-block RD and the whole-block RD.
    float rd_ratio = 1.0f;
    if (sub_block_rdcost[i] > 0 && sub_block_rdcost[i] < rdcost)
      rd_ratio = (float)sub_block_rdcost[i] / (float)rdcost;
    features->after_part_ab.f[feature_index++] = rd_ratio;
  }

  // 4-way partitions are only allowed for these three square block sizes.
  assert(bsize == BLOCK_16X16 || bsize == BLOCK_32X32 || bsize == BLOCK_64X64);

  // Get variance of the 1:4 and 4:1 sub-blocks.
  unsigned int horz_4_source_var[SUB_PARTITIONS_PART4] = { 0 };
  unsigned int vert_4_source_var[SUB_PARTITIONS_PART4] = { 0 };
  {
    BLOCK_SIZE horz_4_bs = get_partition_subsize(bsize, PARTITION_HORZ_4);
    BLOCK_SIZE vert_4_bs = get_partition_subsize(bsize, PARTITION_VERT_4);

    assert(horz_4_bs != BLOCK_INVALID);
    assert(vert_4_bs != BLOCK_INVALID);

    av1_setup_src_planes(x, cpi->source, mi_row, mi_col,
                         av1_num_planes(&cpi->common), bsize);
    const int src_stride = x->plane[0].src.stride;
    uint8_t *src = x->plane[0].src.buf;
    const MACROBLOCKD *const xd = &x->e_mbd;

    struct buf_2d horz_4_src, vert_4_src;
    horz_4_src.stride = src_stride;
    vert_4_src.stride = src_stride;

    for (int i = 0; i < SUB_PARTITIONS_PART4; ++i) {
      horz_4_src.buf = src + i * block_size_high[horz_4_bs] * src_stride;
      vert_4_src.buf = src + i * block_size_wide[vert_4_bs];

      horz_4_source_var[i] = av1_get_perpixel_variance_facade(
          cpi, xd, &horz_4_src, horz_4_bs, AOM_PLANE_Y);
      vert_4_source_var[i] = av1_get_perpixel_variance_facade(
          cpi, xd, &vert_4_src, vert_4_bs, AOM_PLANE_Y);
    }
  }

  const float denom = (float)(pb_source_variance + 1);
  const float low_b = 0.1f;
  const float high_b = 10.0f;
  for (int i = 0; i < SUB_PARTITIONS_PART4; ++i) {
    // Ratio between the 4:1 sub-block variance and the whole-block variance.
    float var_ratio = (float)(horz_4_source_var[i] + 1) / denom;
    if (var_ratio < low_b) var_ratio = low_b;
    if (var_ratio > high_b) var_ratio = high_b;
    features->after_part_ab.f[feature_index++] = var_ratio;
  }
  for (int i = 0; i < SUB_PARTITIONS_PART4; ++i) {
    // Ratio between the 1:4 sub-block RD and the whole-block RD.
    float var_ratio = (float)(vert_4_source_var[i] + 1) / denom;
    if (var_ratio < low_b) var_ratio = low_b;
    if (var_ratio > high_b) var_ratio = high_b;
    features->after_part_ab.f[feature_index++] = var_ratio;
  }
  assert(feature_index == 18);
}